

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O1

void __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::setSpatialMatrix
          (SpatialRigidBodyInertia *this,SpatialMatrix *mat)

{
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = this->Ixx
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = this->Iyx
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc] =
       this->Izx;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = this->Iyx
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = this->Iyy
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd] =
       this->Izy;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = this->Izx
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = this->Izy
  ;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe] =
       this->Izz;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x10] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x11] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x12] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x18] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1e] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x13] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x19] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1f] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x14] =
       -(this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1a] =
       (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x20] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x15] =
       this->m;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1b] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x21] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x16] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1c] =
       this->m;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x22] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x17] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1d] = 0.0;
  (mat->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x23] =
       this->m;
  return;
}

Assistant:

void setSpatialMatrix (SpatialMatrix &mat) const {
    mat(0,0) = Ixx; mat(0,1) = Iyx; mat(0,2) = Izx;
    mat(1,0) = Iyx; mat(1,1) = Iyy; mat(1,2) = Izy;
    mat(2,0) = Izx; mat(2,1) = Izy; mat(2,2) = Izz;

    mat(3,0) =    0.; mat(3,1) =  h[2]; mat(3,2) = -h[1];
    mat(4,0) = -h[2]; mat(4,1) =    0.; mat(4,2) =  h[0];
    mat(5,0) =  h[1]; mat(5,1) = -h[0]; mat(5,2) =    0.;

    mat(0,3) =    0.; mat(0,4) = -h[2]; mat(0,5) =  h[1];
    mat(1,3) =  h[2]; mat(1,4) =    0.; mat(1,5) = -h[0];
    mat(2,3) = -h[1]; mat(2,4) =  h[0]; mat(2,5) =    0.;

    mat(3,3) =     m; mat(3,4) =    0.; mat(3,5) =    0.;
    mat(4,3) =    0.; mat(4,4) =     m; mat(4,5) =    0.; 
    mat(5,3) =    0.; mat(5,4) =    0.; mat(5,5) =     m;
  }